

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleComboBox::childAt(QAccessibleComboBox *this,int x,int y)

{
  long lVar1;
  bool bVar2;
  QWidget *this_00;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QComboBox *cBox;
  QComboBox *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  QAccessibleInterface *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &comboBox((QAccessibleComboBox *)0x7d4f52)->super_QWidget;
  if (this_00 != (QWidget *)0x0) {
    bVar2 = QComboBox::isEditable(in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
    if (bVar2) {
      QComboBox::lineEdit(in_stack_ffffffffffffffb0);
      QWidget::rect(this_00);
      bVar2 = QRect::contains(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffbc = (uint)bVar2 << 0x18;
    }
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) != '\0') {
      local_20 = (QAccessibleInterface *)(**(code **)(*(long *)in_RDI + 0x48))(in_RDI,1);
      goto LAB_007d4fd6;
    }
  }
  local_20 = (QAccessibleInterface *)0x0;
LAB_007d4fd6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

QAccessibleInterface *QAccessibleComboBox::childAt(int x, int y) const
{
    if (QComboBox *cBox = comboBox()) {
        if (cBox->isEditable() && cBox->lineEdit()->rect().contains(x, y))
            return child(1);
    }
    return nullptr;
}